

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::internal::CmpHelperEQ<Bar,Bar>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,Bar *expected,Bar *actual)

{
  Bar *actual_expression;
  char *expected_expression;
  bool bVar1;
  string local_70;
  string local_50;
  Bar *local_30;
  Bar *actual_local;
  Bar *expected_local;
  char *actual_str_local;
  char *expected_str_local;
  
  local_30 = expected;
  actual_local = (Bar *)actual_str;
  expected_local = (Bar *)expected_str;
  actual_str_local = (char *)this;
  expected_str_local = (char *)__return_storage_ptr__;
  bVar1 = iuOperatorEQ<Bar,Bar>(expected,(Bar *)actual_str);
  expected_expression = actual_str_local;
  actual_expression = expected_local;
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    FormatForComparisonFailureMessage<Bar,Bar>
              (&local_50,(internal *)actual_local,local_30,(Bar *)actual_str);
    FormatForComparisonFailureMessage<Bar,Bar>
              (&local_70,(internal *)local_30,actual_local,(Bar *)actual_str);
    EqFailure(__return_storage_ptr__,expected_expression,(char *)actual_expression,&local_50,
              &local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }